

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  ImGuiViewportP_conflict1 **ppIVar2;
  ImGuiID *pIVar3;
  int *piVar4;
  ImGuiID IVar5;
  wchar_t wVar6;
  ImGuiShrinkWidthItem *pIVar7;
  ImVec2 IVar8;
  ImGuiID IVar9;
  ImGuiID IVar10;
  ImGuiID IVar11;
  ImGuiID IVar12;
  ImGuiID IVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  ImGuiContext_conflict1 *pIVar19;
  ImGuiContext_conflict1 *pIVar20;
  undefined4 uVar21;
  bool bVar22;
  bool bVar23;
  int section_n;
  long lVar24;
  ImGuiTabItem *pIVar25;
  char *pcVar26;
  ImGuiWindow_conflict *pIVar27;
  char *__dest;
  uint uVar28;
  long lVar29;
  ImGuiWindow_conflict *pIVar30;
  ulong uVar31;
  ImGuiWindow_conflict *pIVar32;
  int iVar33;
  int iVar34;
  ImGuiTabItem *pIVar35;
  uint uVar36;
  ulong uVar37;
  ImGuiTabItem *pIVar38;
  ulong uVar39;
  long lVar40;
  uint uVar41;
  long lVar42;
  int iVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  ImGuiID local_100;
  undefined8 local_f0;
  float local_e8 [3];
  uint uStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  undefined1 local_b8 [16];
  int local_a4 [2];
  float local_9c;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ImVec4 local_88;
  ImVec2 local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  pIVar20 = GImGui;
  tab_bar->WantLayout = false;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  stack0xffffffffffffff20 = 0;
  local_c8 = 0.0;
  uVar41 = (tab_bar->Tabs).Size;
  uVar39 = (ulong)uVar41;
  if ((int)uVar41 < 1) {
    bVar22 = false;
    uVar28 = 0;
  }
  else {
    lVar24 = 0;
    uVar37 = 0;
    uVar28 = 0;
    bVar22 = false;
    do {
      pIVar35 = (tab_bar->Tabs).Data;
      pIVar3 = (ImGuiID *)((long)&pIVar35->ID + lVar24);
      if ((*(int *)((long)&pIVar35->LastFrameVisible + lVar24) < tab_bar->PrevFrameVisible) ||
         ((&pIVar35->WantClose)[lVar24] == true)) {
        IVar5 = *pIVar3;
        if (tab_bar->VisibleTabId == IVar5) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == IVar5) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == IVar5) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        uVar31 = (ulong)uVar28;
        if (uVar37 != uVar31) {
          if (((int)uVar28 < 0) || ((int)uVar39 <= (int)uVar28)) goto LAB_00237086;
          IVar5 = *pIVar3;
          IVar9 = pIVar3[1];
          IVar10 = pIVar3[2];
          IVar11 = pIVar3[3];
          IVar12 = pIVar3[4];
          IVar13 = pIVar3[5];
          fVar46 = (float)pIVar3[6];
          fVar44 = (float)pIVar3[7];
          *(undefined1 (*) [16])((long)&pIVar35[uVar31].Width + 1) =
               *(undefined1 (*) [16])((long)pIVar3 + 0x1d);
          piVar4 = &pIVar35[uVar31].LastFrameVisible;
          *piVar4 = IVar12;
          piVar4[1] = IVar13;
          piVar4[2] = (int)fVar46;
          piVar4[3] = (int)fVar44;
          pIVar35 = pIVar35 + uVar31;
          pIVar35->ID = IVar5;
          pIVar35->Flags = IVar9;
          *(ImGuiID *)&pIVar35->Window = IVar10;
          *(ImGuiID *)((long)&pIVar35->Window + 4) = IVar11;
        }
        if (((int)uVar28 < 0) || ((tab_bar->Tabs).Size <= (int)uVar28)) goto LAB_00237086;
        pIVar35 = (tab_bar->Tabs).Data;
        pIVar35[uVar31].IndexDuringLayout = (ImS16)uVar28;
        uVar41 = pIVar35[uVar31].Flags;
        lVar42 = 0;
        if ((uVar41 & 0x40) == 0) {
          lVar42 = (ulong)((char)uVar41 < '\0') + 1;
        }
        if (0 < (int)uVar28) {
          if ((tab_bar->Tabs).Size < (int)uVar28) goto LAB_00237086;
          bVar23 = bVar22;
          if ((pIVar35[uVar31 - 1].Flags & 0x40U) == 0) {
            bVar23 = true;
          }
          if ((uVar41 & 0x40) == 0) {
            bVar23 = bVar22;
          }
          bVar22 = bVar23;
          if ((pIVar35[uVar31 - 1].Flags & 0xc0U) == 0x80) {
            bVar22 = true;
          }
          if ((uVar41 & 0xc0) == 0x80) {
            bVar22 = bVar23;
          }
        }
        local_e8[lVar42 * 3] = (float)((int)local_e8[lVar42 * 3] + 1);
        uVar28 = uVar28 + 1;
      }
      uVar37 = uVar37 + 1;
      uVar41 = (tab_bar->Tabs).Size;
      uVar39 = (ulong)(int)uVar41;
      lVar24 = lVar24 + 0x30;
    } while ((long)uVar37 < (long)uVar39);
  }
  if (uVar41 != uVar28) {
    iVar33 = (tab_bar->Tabs).Capacity;
    if (iVar33 < (int)uVar28) {
      if (iVar33 == 0) {
        uVar41 = 8;
      }
      else {
        uVar41 = iVar33 / 2 + iVar33;
      }
      if ((int)uVar41 <= (int)uVar28) {
        uVar41 = uVar28;
      }
      if (iVar33 < (int)uVar41) {
        pIVar25 = (ImGuiTabItem *)MemAlloc((long)(int)uVar41 * 0x30);
        pIVar35 = (tab_bar->Tabs).Data;
        if (pIVar35 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar25,pIVar35,(long)(tab_bar->Tabs).Size * 0x30);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar25;
        (tab_bar->Tabs).Capacity = uVar41;
      }
    }
    (tab_bar->Tabs).Size = uVar28;
  }
  if (bVar22) {
    qsort((tab_bar->Tabs).Data,(long)(tab_bar->Tabs).Size,0x30,TabItemComparerBySection);
  }
  fVar45 = local_e8[0];
  fVar44 = 0.0;
  fVar46 = 0.0;
  iVar33 = (int)uStack_d0;
  if ((0 < (int)local_e8[0]) &&
     ((int)uStack_d0 + uStack_dc != 0 &&
      SCARRY4((int)uStack_d0,uStack_dc) == (int)((int)uStack_d0 + uStack_dc) < 0)) {
    fVar46 = (pIVar20->Style).ItemInnerSpacing.x;
  }
  stack0xffffffffffffff20 = CONCAT44(uStack_dc,fVar46);
  if (0 < (int)uStack_d0 && 0 < (int)uStack_dc) {
    fVar44 = (pIVar20->Style).ItemInnerSpacing.x;
  }
  local_d8 = CONCAT44(fVar44,(float)local_d8);
  local_100 = tab_bar->NextSelectedTabId;
  if (local_100 == 0) {
    local_100 = 0;
  }
  else {
    tab_bar->SelectedTabId = local_100;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar22 = TabBarProcessReorder(tab_bar);
    if ((bVar22) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      local_100 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar19 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    local_f0 = GImGui->CurrentWindow;
    fVar46 = (GImGui->Style).FramePadding.y;
    fVar44 = GImGui->FontSize;
    local_b8._0_4_ = (local_f0->DC).CursorPos.x;
    local_b8._4_4_ = (local_f0->DC).CursorPos.y;
    fVar47 = (tab_bar->BarRect).Min.y;
    (local_f0->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar46;
    (local_f0->DC).CursorPos.y = fVar47;
    (tab_bar->BarRect).Min.x = fVar44 + fVar46 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar19->Style).Colors[0].x;
    local_58.y = (pIVar19->Style).Colors[0].y;
    uVar14 = (pIVar19->Style).Colors[0].z;
    uVar15 = (pIVar19->Style).Colors[0].w;
    local_58.w = (float)uVar15 * 0.5;
    local_58.z = (float)uVar14;
    pIVar35 = (ImGuiTabItem *)0x0;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    bVar22 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar22) {
      if ((tab_bar->Tabs).Size < 1) {
        pIVar35 = (ImGuiTabItem *)0x0;
      }
      else {
        lVar42 = 0;
        lVar24 = 0;
        pIVar35 = (ImGuiTabItem *)0x0;
        do {
          pIVar25 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar25->Flags + lVar42 + 2) & 0x20) == 0) {
            pIVar25 = (ImGuiTabItem *)((long)&pIVar25->ID + lVar42);
            pcVar26 = ImGuiTabBar::GetTabName(tab_bar,pIVar25);
            local_88.x = 0.0;
            local_88.y = 0.0;
            bVar22 = Selectable(pcVar26,tab_bar->SelectedTabId == pIVar25->ID,0,(ImVec2 *)&local_88)
            ;
            if (bVar22) {
              pIVar35 = pIVar25;
            }
          }
          lVar24 = lVar24 + 1;
          lVar42 = lVar42 + 0x30;
        } while (lVar24 < (tab_bar->Tabs).Size);
      }
      EndPopup();
    }
    auVar18 = local_b8;
    (local_f0->DC).CursorPos.x = (float)local_b8._0_4_;
    (local_f0->DC).CursorPos.y = (float)local_b8._4_4_;
    local_b8 = auVar18;
    if (pIVar35 != (ImGuiTabItem *)0x0) {
      local_100 = pIVar35->ID;
      tab_bar->SelectedTabId = local_100;
    }
  }
  local_a4[0] = 0;
  local_a4[1] = iVar33 + (int)fVar45;
  pIVar27 = (ImGuiWindow_conflict *)(ulong)(uint)local_a4[1];
  local_9c = fVar45;
  iVar33 = (tab_bar->Tabs).Size;
  iVar34 = (pIVar20->ShrinkWidthBuffer).Capacity;
  if (iVar34 < iVar33) {
    if (iVar34 == 0) {
      iVar43 = 8;
    }
    else {
      iVar43 = iVar34 / 2 + iVar34;
    }
    if (iVar43 <= iVar33) {
      iVar43 = iVar33;
    }
    if (iVar34 < iVar43) {
      pIVar27 = (ImGuiWindow_conflict *)MemAlloc((long)iVar43 << 3);
      pIVar7 = (pIVar20->ShrinkWidthBuffer).Data;
      if (pIVar7 != (ImGuiShrinkWidthItem *)0x0) {
        memcpy(pIVar27,pIVar7,(long)(pIVar20->ShrinkWidthBuffer).Size << 3);
        MemFree((pIVar20->ShrinkWidthBuffer).Data);
      }
      (pIVar20->ShrinkWidthBuffer).Data = (ImGuiShrinkWidthItem *)pIVar27;
      (pIVar20->ShrinkWidthBuffer).Capacity = iVar43;
    }
  }
  (pIVar20->ShrinkWidthBuffer).Size = iVar33;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_b8._8_8_;
  local_b8 = auVar18 << 0x40;
  if ((tab_bar->Tabs).Size < 1) {
    bVar22 = true;
    pIVar30 = (ImGuiWindow_conflict *)0x0;
  }
  else {
    lVar24 = 0;
    lVar42 = 0;
    bVar22 = false;
    pIVar30 = (ImGuiWindow_conflict *)0x0;
    iVar33 = -1;
    do {
      pIVar27 = (ImGuiWindow_conflict *)(tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar27->FlagsPreviousFrame + lVar24) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                      ,0x1ce0,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      pIVar32 = (ImGuiWindow_conflict *)((long)&pIVar27->Name + lVar24);
      local_f0 = pIVar30;
      if (((pIVar30 == (ImGuiWindow_conflict *)0x0) ||
          ((int)(pIVar30->WindowClass).ClassId <
           *(int *)((long)&(pIVar27->WindowClass).ClassId + lVar24))) &&
         ((*(byte *)((long)&pIVar27->Name + lVar24 + 6) & 0x20) == 0)) {
        local_f0 = pIVar32;
      }
      IVar5 = *(ImGuiID *)&pIVar32->Name;
      if (IVar5 == tab_bar->SelectedTabId) {
        bVar22 = true;
      }
      if ((local_100 == 0) && (local_100 = IVar5, pIVar20->NavJustMovedToId != IVar5)) {
        local_100 = 0;
      }
      pcVar26 = ImGuiTabBar::GetTabName(tab_bar,(ImGuiTabItem *)pIVar32);
      IVar8 = TabItemCalcSize(pcVar26,(*(uint *)((long)&pIVar27->Name + lVar24 + 4) >> 0x14 & 1) ==
                                      0);
      auVar18 = local_b8;
      fVar46 = IVar8.x;
      *(float *)((long)&(pIVar27->WindowClass).ViewportFlagsOverrideClear + lVar24) = fVar46;
      uVar41 = *(uint *)((long)&pIVar27->Name + lVar24 + 4);
      uVar39 = (ulong)(((char)uVar41 < '\0') + 1);
      if ((uVar41 & 0x40) != 0) {
        uVar39 = 0;
      }
      fVar44 = 0.0;
      if ((int)uVar39 == iVar33) {
        fVar44 = (pIVar20->Style).ItemInnerSpacing.x;
      }
      local_e8[uVar39 * 3 + 1] = fVar44 + fVar46 + local_e8[uVar39 * 3 + 1];
      iVar33 = local_a4[uVar39];
      lVar29 = (long)iVar33;
      local_a4[uVar39] = iVar33 + 1;
      if ((lVar29 < 0) || ((pIVar20->ShrinkWidthBuffer).Size <= iVar33)) goto LAB_002370a5;
      pIVar7 = (pIVar20->ShrinkWidthBuffer).Data;
      pIVar7[lVar29].Index = (wchar_t)lVar42;
      if ((pIVar20->ShrinkWidthBuffer).Size <= iVar33) goto LAB_002370a5;
      pIVar7[lVar29].Width = fVar46;
      if (fVar46 <= 0.0) {
        __assert_fail("tab->ContentWidth > 0.0f",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                      ,0x1cfb,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      *(float *)((long)&(pIVar27->WindowClass).ViewportFlagsOverrideSet + lVar24) = fVar46;
      lVar42 = lVar42 + 1;
      iVar34 = (tab_bar->Tabs).Size;
      lVar24 = lVar24 + 0x30;
      pIVar30 = local_f0;
      iVar33 = (int)uVar39;
    } while (lVar42 < iVar34);
    local_b8._1_7_ = 0;
    local_b8[0] = 1 < iVar34;
    local_b8._8_8_ = auVar18._8_8_;
    bVar22 = !bVar22;
  }
  tab_bar->WidthAllTabsIdeal = 0.0;
  fVar46 = 0.0;
  lVar24 = 8;
  do {
    fVar46 = fVar46 + *(float *)((long)&local_f0 + lVar24 + 4) + *(float *)((long)local_e8 + lVar24)
    ;
    lVar24 = lVar24 + 0xc;
  } while (lVar24 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar46;
  pIVar19 = GImGui;
  if (((local_b8[0] & (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x < fVar46) != 0) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar27 = GImGui->CurrentWindow;
    fVar44 = GImGui->FontSize + -2.0;
    local_b8 = ZEXT416((uint)fVar44);
    fVar46 = (GImGui->Style).FramePadding.y;
    _local_98 = ZEXT416((uint)(fVar46 + fVar46 + GImGui->FontSize));
    local_68 = ZEXT416((uint)(fVar44 + fVar44));
    local_78 = (pIVar27->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar16 = (GImGui->Style).Colors[0].z;
    uVar17 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar17 * 0.5;
    local_58.z = (float)uVar16;
    pIVar25 = (ImGuiTabItem *)0x0;
    local_f0 = pIVar30;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    local_70._0_4_ = (pIVar19->IO).KeyRepeatDelay;
    local_70._4_4_ = (pIVar19->IO).KeyRepeatRate;
    (pIVar19->IO).KeyRepeatDelay = 0.25;
    (pIVar19->IO).KeyRepeatRate = 0.2;
    fVar46 = (tab_bar->BarRect).Min.x;
    fVar44 = (tab_bar->BarRect).Max.x - (float)local_68._0_4_;
    uVar41 = -(uint)(fVar44 <= fVar46);
    fVar44 = (float)(uVar41 & (uint)fVar46 | ~uVar41 & (uint)fVar44);
    local_48 = ZEXT416((uint)fVar44);
    fVar46 = (tab_bar->BarRect).Min.y;
    (pIVar27->DC).CursorPos.x = fVar44;
    (pIVar27->DC).CursorPos.y = fVar46;
    uVar21 = local_98._0_4_;
    uStack_8c = local_98._4_4_;
    local_98._4_4_ = local_98._0_4_;
    local_98._0_4_ = local_b8._0_4_;
    uStack_90 = local_b8._4_4_;
    IVar8.y = (float)uVar21;
    IVar8.x = (float)local_b8._0_4_;
    bVar23 = ArrowButtonEx("##<",0,IVar8,0x410);
    iVar33 = -(uint)bVar23;
    fVar46 = (tab_bar->BarRect).Min.y;
    (pIVar27->DC).CursorPos.x = (float)local_48._0_4_ + (float)local_b8._0_4_;
    (pIVar27->DC).CursorPos.y = fVar46;
    pIVar35 = (ImGuiTabItem *)0x1;
    bVar23 = ArrowButtonEx("##>",1,(ImVec2)local_98,0x410);
    if (bVar23) {
      iVar33 = 1;
    }
    PopStyleColor(2);
    (pIVar19->IO).KeyRepeatDelay = (float)(undefined4)local_70;
    (pIVar19->IO).KeyRepeatRate = (float)local_70._4_4_;
    if (iVar33 != 0) {
      IVar5 = tab_bar->SelectedTabId;
      if (IVar5 == 0) {
LAB_002369ab:
        pIVar35 = (ImGuiTabItem *)0x0;
      }
      else {
        uVar39 = (ulong)(tab_bar->Tabs).Size;
        bVar23 = 0 < (long)uVar39;
        if (0 < (long)uVar39) {
          pIVar35 = (tab_bar->Tabs).Data;
          bVar23 = true;
          if (pIVar35->ID != IVar5) {
            pIVar38 = pIVar35 + (uVar39 - 1);
            uVar37 = 0;
            pIVar25 = pIVar35;
            do {
              uVar31 = uVar39;
              pIVar35 = pIVar38;
              if (uVar39 - 1 == uVar37) break;
              pIVar35 = pIVar25 + 1;
              uVar31 = uVar37 + 1;
              pIVar1 = pIVar25 + 1;
              uVar37 = uVar31;
              pIVar25 = pIVar35;
            } while (pIVar1->ID != IVar5);
            bVar23 = uVar31 < uVar39;
          }
        }
        if (!bVar23) goto LAB_002369ab;
      }
      if (pIVar35 == (ImGuiTabItem *)0x0) {
        pIVar25 = (ImGuiTabItem *)0x0;
      }
      else {
        uVar41 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar35);
        uVar28 = uVar41 + iVar33;
        iVar34 = (tab_bar->Tabs).Size;
        do {
          uVar36 = uVar41;
          if ((int)uVar28 < iVar34) {
            uVar36 = uVar28;
          }
          if ((int)uVar28 < 0) {
            uVar36 = uVar41;
          }
          if (((int)uVar36 < 0) || (iVar34 <= (int)uVar36)) goto LAB_00237086;
          pIVar35 = (tab_bar->Tabs).Data;
          pIVar25 = pIVar35 + uVar36;
          if ((pIVar35[uVar36].Flags & 0x200000) != 0) {
            pIVar35 = pIVar25;
            if ((int)(uVar28 + iVar33) < iVar34) {
              pIVar35 = (ImGuiTabItem *)0x0;
            }
            uVar28 = uVar28 + iVar33;
            if (-1 < (int)uVar28) {
              pIVar25 = pIVar35;
            }
            uVar41 = uVar41 + iVar33;
          }
        } while (pIVar25 == (ImGuiTabItem *)0x0);
      }
    }
    (pIVar27->DC).CursorPos = local_78;
    (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - ((float)local_68._0_4_ + 1.0);
    pIVar30 = local_f0;
    if ((pIVar25 != (ImGuiTabItem *)0x0) &&
       (local_100 = pIVar25->ID, (pIVar25->Flags & 0x200000) == 0)) {
      tab_bar->SelectedTabId = local_100;
    }
  }
  fVar46 = local_e8[1] + local_e8[2] + uStack_d0._4_4_ + local_c8;
  fVar44 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  if (fVar46 < fVar44) {
    fVar45 = (local_d8._4_4_ + (float)local_d8) -
             ((fVar44 - (local_e8[1] + local_e8[2])) - (uStack_d0._4_4_ + local_c8));
    fVar45 = (float)(-(uint)(0.0 <= fVar45) & (uint)fVar45);
  }
  else {
    fVar45 = fVar46 - fVar44;
  }
  if ((0.0 < fVar45) && ((fVar44 <= fVar46 || ((tab_bar->Flags & 0x40U) != 0)))) {
    uVar41 = (int)uStack_d0 + (int)local_e8[0];
    pIVar27 = (ImGuiWindow_conflict *)(ulong)uVar41;
    if (fVar44 <= fVar46) {
      pIVar27 = (ImGuiWindow_conflict *)0x0;
    }
    else {
      uVar41 = uStack_dc;
    }
    iVar33 = (int)pIVar27;
    ShrinkWidths((ImGuiShrinkWidthItem_conflict *)((pIVar20->ShrinkWidthBuffer).Data + iVar33),
                 uVar41,fVar45);
    if (0 < (int)uVar41) {
      pIVar32 = pIVar27;
      do {
        if ((iVar33 < 0) || ((pIVar20->ShrinkWidthBuffer).Size <= (int)pIVar32)) goto LAB_002370a5;
        pIVar7 = (pIVar20->ShrinkWidthBuffer).Data;
        wVar6 = pIVar7[(long)pIVar32].Index;
        lVar24 = (long)wVar6;
        if ((lVar24 < 0) || ((tab_bar->Tabs).Size <= wVar6)) goto LAB_00237086;
        iVar34 = (int)pIVar7[(long)pIVar32].Width;
        if (-1 < iVar34) {
          pIVar35 = (tab_bar->Tabs).Data;
          fVar46 = (float)iVar34;
          lVar42 = (ulong)((char)pIVar35[lVar24].Flags < '\0') + 1;
          if ((pIVar35[lVar24].Flags & 0x40U) != 0) {
            lVar42 = 0;
          }
          local_e8[lVar42 * 3 + 1] = local_e8[lVar42 * 3 + 1] - (pIVar35[lVar24].Width - fVar46);
          pIVar35[lVar24].Width = fVar46;
        }
        pIVar32 = (ImGuiWindow_conflict *)((long)&pIVar32->Name + 1);
      } while ((int)pIVar32 < (int)(uVar41 + iVar33));
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  lVar24 = 0;
  fVar46 = 0.0;
  uVar41 = 0;
  do {
    fVar44 = fVar46;
    if ((lVar24 == 2) &&
       (fVar44 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_e8[7],
       fVar44 = (float)(~-(uint)(fVar44 <= 0.0) & (uint)fVar44), fVar46 <= fVar44)) {
      fVar44 = fVar46;
    }
    fVar45 = local_e8[lVar24 * 3];
    lVar42 = (long)(int)fVar45;
    if (0 < lVar42) {
      lVar29 = (ulong)uVar41 * 0x30;
      lVar40 = 0;
      do {
        if (((int)uVar41 < 0) || ((tab_bar->Tabs).Size <= (int)(uVar41 + (int)lVar40)))
        goto LAB_00237086;
        pIVar35 = (tab_bar->Tabs).Data;
        *(float *)((long)&pIVar35->Offset + lVar29) = fVar44;
        *(undefined4 *)((long)&pIVar35->NameOffset + lVar29) = 0xffffffff;
        fVar46 = 0.0;
        if (lVar40 < lVar42 + -1) {
          fVar46 = (pIVar20->Style).ItemInnerSpacing.x;
        }
        fVar44 = fVar44 + fVar46 + *(float *)((long)&pIVar35->Width + lVar29);
        lVar40 = lVar40 + 1;
        lVar29 = lVar29 + 0x30;
      } while (lVar42 != lVar40);
    }
    fVar46 = local_e8[lVar24 * 3 + 2];
    fVar47 = local_e8[lVar24 * 3 + 1] + fVar46;
    tab_bar->WidthAllTabs = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47) + tab_bar->WidthAllTabs;
    fVar46 = fVar44 + fVar46;
    uVar41 = (int)fVar45 + uVar41;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 3);
  iVar33 = (tab_bar->TabsNames).Buf.Capacity;
  if (iVar33 < 0) {
    uVar41 = iVar33 / 2 + iVar33;
    pIVar27 = (ImGuiWindow_conflict *)0x0;
    if (0 < (int)uVar41) {
      pIVar27 = (ImGuiWindow_conflict *)(ulong)uVar41;
    }
    __dest = (char *)MemAlloc((size_t)pIVar27);
    pcVar26 = (tab_bar->TabsNames).Buf.Data;
    if (pcVar26 != (char *)0x0) {
      memcpy(__dest,pcVar26,(long)(tab_bar->TabsNames).Buf.Size);
      MemFree((tab_bar->TabsNames).Buf.Data);
    }
    (tab_bar->TabsNames).Buf.Data = __dest;
    (tab_bar->TabsNames).Buf.Capacity = (int)pIVar27;
  }
  (tab_bar->TabsNames).Buf.Size = 0;
  if (bVar22) {
    tab_bar->SelectedTabId = 0;
  }
  if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
     (pIVar30 != (ImGuiWindow_conflict *)0x0)) {
    local_100 = *(ImGuiID *)&pIVar30->Name;
    tab_bar->SelectedTabId = local_100;
  }
  tab_bar->VisibleTabId = tab_bar->SelectedTabId;
  tab_bar->VisibleTabWasSubmitted = false;
  pIVar30 = pIVar20->NavWindowingTarget;
  if (((pIVar30 != (ImGuiWindow_conflict *)0x0) && (pIVar30->DockNode != (ImGuiDockNode *)0x0)) &&
     (pIVar30->DockNode->TabBar == tab_bar)) {
    local_100 = pIVar30->ID;
    tab_bar->VisibleTabId = local_100;
  }
  if (local_100 != 0) {
    uVar39 = (ulong)(tab_bar->Tabs).Size;
    bVar22 = 0 < (long)uVar39;
    if (0 < (long)uVar39) {
      pIVar27 = (ImGuiWindow_conflict *)(tab_bar->Tabs).Data;
      bVar22 = true;
      if (*(ImGuiID *)&pIVar27->Name != local_100) {
        pIVar32 = (ImGuiWindow_conflict *)((long)pIVar27 + uVar39 * 0x30 + -0x30);
        uVar37 = 0;
        pIVar30 = pIVar27;
        do {
          uVar31 = uVar39;
          pIVar27 = pIVar32;
          if (uVar39 - 1 == uVar37) break;
          pIVar27 = (ImGuiWindow_conflict *)&pIVar30->Viewport;
          uVar31 = uVar37 + 1;
          ppIVar2 = &pIVar30->Viewport;
          uVar37 = uVar31;
          pIVar30 = pIVar27;
        } while (*(ImGuiID *)ppIVar2 != local_100);
        bVar22 = uVar31 < uVar39;
      }
    }
    if (((bVar22) && (pIVar27 != (ImGuiWindow_conflict *)0x0)) &&
       (((ulong)pIVar27->Name & 0xc000000000) == 0)) {
      local_f0 = (ImGuiWindow_conflict *)CONCAT44(local_f0._4_4_,GImGui->FontSize);
      iVar33 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)pIVar27);
      fVar44 = (float)(pIVar27->WindowClass).ParentViewportId - local_e8[1];
      fVar46 = (float)local_f0;
      if (iVar33 < (int)local_e8[0]) {
        fVar46 = -0.0;
      }
      fVar46 = fVar44 - fVar46;
      fVar45 = (float)local_f0;
      if ((tab_bar->Tabs).Size - (int)uStack_d0 <= iVar33 + 1) {
        fVar45 = 1.0;
      }
      fVar45 = fVar44 + (float)(pIVar27->WindowClass).ViewportFlagsOverrideSet + fVar45;
      fVar44 = ((((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_e8[1]) -
               uStack_d0._4_4_) - local_d8._4_4_;
      tab_bar->ScrollingTargetDistToVisibility = 0.0;
      if ((fVar46 < tab_bar->ScrollingTarget) || (fVar44 <= fVar45 - fVar46)) {
        fVar47 = tab_bar->ScrollingAnim - fVar45;
      }
      else {
        if (fVar45 - fVar44 <= tab_bar->ScrollingTarget) goto LAB_00236ebb;
        fVar47 = (fVar46 - fVar44) - tab_bar->ScrollingAnim;
        fVar46 = fVar45 - fVar44;
      }
      tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
      tab_bar->ScrollingTarget = fVar46;
    }
  }
LAB_00236ebb:
  fVar46 = (tab_bar->BarRect).Min.x;
  fVar44 = (tab_bar->BarRect).Max.x;
  fVar47 = tab_bar->WidthAllTabs - (fVar44 - fVar46);
  fVar45 = tab_bar->ScrollingAnim;
  if (fVar47 <= tab_bar->ScrollingAnim) {
    fVar45 = fVar47;
  }
  fVar45 = (float)(-(uint)(0.0 <= fVar45) & (uint)fVar45);
  tab_bar->ScrollingAnim = fVar45;
  fVar48 = tab_bar->ScrollingTarget;
  if (fVar47 <= tab_bar->ScrollingTarget) {
    fVar48 = fVar47;
  }
  fVar48 = (float)(-(uint)(0.0 <= fVar48) & (uint)fVar48);
  tab_bar->ScrollingTarget = fVar48;
  if ((fVar45 != fVar48) || (NAN(fVar45) || NAN(fVar48))) {
    fVar47 = pIVar20->FontSize;
    fVar49 = fVar47 * 70.0;
    uVar41 = -(uint)(fVar49 <= tab_bar->ScrollingSpeed);
    fVar50 = ABS(fVar48 - fVar45) / 0.3;
    fVar49 = (float)(~uVar41 & (uint)fVar49 | (uint)tab_bar->ScrollingSpeed & uVar41);
    uVar41 = -(uint)(fVar50 <= fVar49);
    fVar50 = (float)(~uVar41 & (uint)fVar50 | uVar41 & (uint)fVar49);
    tab_bar->ScrollingSpeed = fVar50;
    fVar49 = fVar48;
    if ((pIVar20->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar47 * 10.0)) {
      fVar50 = fVar50 * (pIVar20->IO).DeltaTime;
      if (fVar48 <= fVar45) {
        fVar49 = fVar45;
        if (fVar48 < fVar45) {
          fVar45 = fVar45 - fVar50;
          uVar41 = -(uint)(fVar48 <= fVar45);
          fVar49 = (float)((uint)fVar45 & uVar41 | ~uVar41 & (uint)fVar48);
        }
      }
      else {
        fVar49 = fVar50 + fVar45;
        if (fVar48 <= fVar49) {
          fVar49 = fVar48;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar49;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = fVar46 + local_e8[1] + local_e8[2];
  tab_bar->ScrollingRectMaxX = (fVar44 - uStack_d0._4_4_) - local_d8._4_4_;
  pIVar27 = pIVar20->CurrentWindow;
  (pIVar27->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabs;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  fVar44 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar46 = (pIVar27->DC).IdealMaxPos.x;
  uVar41 = -(uint)(fVar44 <= fVar46);
  (pIVar27->DC).IdealMaxPos.x = (float)(uVar41 & (uint)fVar46 | ~uVar41 & (uint)fVar44);
  return;
LAB_002370a5:
  pcVar26 = "T &ImVector<ImGuiShrinkWidthItem>::operator[](int) [T = ImGuiShrinkWidthItem]";
  goto LAB_0023709b;
LAB_00237086:
  pcVar26 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_0023709b:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x706,pcVar26);
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = TabItemGetSectionIdx(tab);
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = TabItemGetSectionIdx(prev_tab);
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_to_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_to_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_to_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_to_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_to_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_to_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = TabItemGetSectionIdx(tab);
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        IM_MSVC_WARNING_SUPPRESS(6385);
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_and_select_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_to_tab_id = scroll_and_select_tab->ID;
            if ((scroll_and_select_tab->Flags & ImGuiTabItemFlags_Button) == 0)
                tab_bar->SelectedTabId = scroll_to_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = TabItemGetSectionIdx(tab);
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab->NameOffset = -1;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // Clear name buffers
    tab_bar->TabsNames.Buf.resize(0);

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_to_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // CTRL+TAB can override visible tab temporarily
    if (g.NavWindowingTarget != NULL && g.NavWindowingTarget->DockNode && g.NavWindowingTarget->DockNode->TabBar == tab_bar)
        tab_bar->VisibleTabId = scroll_to_tab_id = g.NavWindowingTarget->ID;

    // Update scrolling
    if (scroll_to_tab_id != 0)
        TabBarScrollToTab(tab_bar, scroll_to_tab_id, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabs, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}